

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

void Bac_NtkDeriveFanout(Bac_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int local_18;
  int iCo;
  int iCi;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_NtkHasFanouts(p);
  if (iVar1 != 0) {
    __assert_fail("!Bac_NtkHasFanouts(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                  ,0xf4,"void Bac_NtkDeriveFanout(Bac_Ntk_t *)");
  }
  Bac_NtkStartFanouts(p);
  local_18 = 0;
  do {
    iVar1 = Bac_NtkObjNum(p);
    if (iVar1 <= local_18) {
      for (local_18 = 0; iVar1 = Bac_NtkObjNum(p), local_18 < iVar1; local_18 = local_18 + 1) {
        iVar1 = Bac_ObjIsCo(p,local_18);
        if ((iVar1 != 0) && (iVar1 = Bac_ObjNextFanout(p,local_18), iVar1 == 0)) {
          iVar1 = Bac_ObjFanin(p,local_18);
          Bac_ObjSetFanout(p,iVar1,local_18);
        }
      }
      return;
    }
    iVar1 = Bac_ObjIsCo(p,local_18);
    if (iVar1 != 0) {
      iVar1 = Bac_ObjNextFanout(p,local_18);
      if (iVar1 != 0) {
        __assert_fail("!Bac_ObjNextFanout(p, iCo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                      ,0xf8,"void Bac_NtkDeriveFanout(Bac_Ntk_t *)");
      }
      iVar1 = Bac_ObjFanin(p,local_18);
      iVar2 = Bac_ObjFanout(p,iVar1);
      if (iVar2 != 0) {
        iVar2 = Bac_ObjFanout(p,iVar1);
        Bac_ObjSetNextFanout(p,iVar2,local_18);
      }
      Bac_ObjSetFanout(p,iVar1,local_18);
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void Bac_NtkDeriveFanout( Bac_Ntk_t * p )
{
    int iCi, iCo;
    assert( !Bac_NtkHasFanouts(p) );
    Bac_NtkStartFanouts( p );
    Bac_NtkForEachCo( p, iCo )
    {
        assert( !Bac_ObjNextFanout(p, iCo) );
        iCi = Bac_ObjFanin(p, iCo);
        if ( Bac_ObjFanout(p, iCi) )
            Bac_ObjSetNextFanout( p, Bac_ObjFanout(p, iCi), iCo );
        Bac_ObjSetFanout( p, iCi, iCo );
    }
    Bac_NtkForEachCo( p, iCo )
        if ( !Bac_ObjNextFanout(p, iCo) )
            Bac_ObjSetFanout( p, Bac_ObjFanin(p, iCo), iCo );
}